

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
::
find_or_prepare_insert_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
          *this,pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>
                *key)

{
  ctrl_t *pcVar1;
  Message *pMVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  long lVar9;
  slot_type *psVar10;
  ctrl_t *pcVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  ushort uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  __m128i match;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  FindInfo FVar26;
  ctrl_t cVar21;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  
  pcVar11 = *(ctrl_t **)(this + 0x10);
  pMVar2 = key->first;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pMVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)&(pMVar2->super_MessageLite)._vptr_MessageLite +
                 (SUB168(auVar19 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar19 * ZEXT816(0x9ddfea08eb382d69),8));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)key->second;
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar18 = SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar14 = uVar18 >> 7 ^ (ulong)pcVar11 >> 0xc;
  auVar19 = ZEXT216(CONCAT11((char)uVar18,(char)uVar18) & 0x7f7f);
  auVar19 = pshuflw(auVar19,auVar19,0);
  lVar9 = *(long *)(this + 0x18);
  uVar17 = 0;
  do {
    uVar14 = uVar14 & uVar3;
    pcVar1 = pcVar11 + uVar14;
    cVar21 = auVar19[0];
    auVar22[0] = -(cVar21 == *pcVar1);
    cVar23 = auVar19[1];
    auVar22[1] = -(cVar23 == pcVar1[1]);
    cVar24 = auVar19[2];
    auVar22[2] = -(cVar24 == pcVar1[2]);
    cVar25 = auVar19[3];
    auVar22[3] = -(cVar25 == pcVar1[3]);
    auVar22[4] = -(cVar21 == pcVar1[4]);
    auVar22[5] = -(cVar23 == pcVar1[5]);
    auVar22[6] = -(cVar24 == pcVar1[6]);
    auVar22[7] = -(cVar25 == pcVar1[7]);
    auVar22[8] = -(cVar21 == pcVar1[8]);
    auVar22[9] = -(cVar23 == pcVar1[9]);
    auVar22[10] = -(cVar24 == pcVar1[10]);
    auVar22[0xb] = -(cVar25 == pcVar1[0xb]);
    auVar22[0xc] = -(cVar21 == pcVar1[0xc]);
    auVar22[0xd] = -(cVar23 == pcVar1[0xd]);
    auVar22[0xe] = -(cVar24 == pcVar1[0xe]);
    auVar22[0xf] = -(cVar25 == pcVar1[0xf]);
    uVar15 = (ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf;
    uVar13 = (uint)uVar15;
    while (uVar15 != 0) {
      uVar4 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar16 = uVar4 + uVar14 & uVar3;
      if ((*(Message **)(lVar9 + uVar16 * 0x18) == pMVar2) &&
         (*(ErrorLocation *)(lVar9 + 8 + uVar16 * 0x18) == key->second)) {
        if (pcVar11 == (ctrl_t *)0x0) goto LAB_001de5f0;
        psVar10 = (slot_type *)(lVar9 + uVar16 * 0x18);
        pcVar11 = pcVar11 + uVar16;
        bVar12 = false;
        goto LAB_001de5b5;
      }
      uVar15 = (ushort)(uVar13 - 1) & (ushort)uVar13;
      uVar13 = CONCAT22((short)(uVar13 - 1 >> 0x10),uVar15);
    }
    auVar20[0] = -(*pcVar1 == kEmpty);
    auVar20[1] = -(pcVar1[1] == kEmpty);
    auVar20[2] = -(pcVar1[2] == kEmpty);
    auVar20[3] = -(pcVar1[3] == kEmpty);
    auVar20[4] = -(pcVar1[4] == kEmpty);
    auVar20[5] = -(pcVar1[5] == kEmpty);
    auVar20[6] = -(pcVar1[6] == kEmpty);
    auVar20[7] = -(pcVar1[7] == kEmpty);
    auVar20[8] = -(pcVar1[8] == kEmpty);
    auVar20[9] = -(pcVar1[9] == kEmpty);
    auVar20[10] = -(pcVar1[10] == kEmpty);
    auVar20[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar20[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar20[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar20[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar20[0xf] = -(pcVar1[0xf] == kEmpty);
    uVar15 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
    if (uVar15 != 0) {
      cVar8 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (uVar3,uVar18,pcVar11);
      if (cVar8 == '\0') {
        uVar13 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
      }
      else {
        uVar5 = 0xf;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar13 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      FVar26.offset = uVar13 + uVar14 & uVar3;
      FVar26.probe_length = uVar17;
      lVar9 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                        ((CommonFields *)this,uVar18,FVar26,
                         (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
LAB_001de5f0:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>]"
                     );
      }
      pcVar11 = (ctrl_t *)(*(long *)(this + 0x10) + lVar9);
      psVar10 = (slot_type *)(lVar9 * 0x18 + *(long *)(this + 0x18));
      bVar12 = true;
LAB_001de5b5:
      (__return_storage_ptr__->first).ctrl_ = pcVar11;
      (__return_storage_ptr__->first).field_1.slot_ = psVar10;
      __return_storage_ptr__->second = bVar12;
      return __return_storage_ptr__;
    }
    uVar14 = uVar14 + uVar17 + 0x10;
    uVar17 = uVar17 + 0x10;
    if (uVar3 < uVar17) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>, K = std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }